

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O0

bool __thiscall
booster::aio::event_loop_impl::run_one(event_loop_impl *this,event *evs,size_t evs_size)

{
  uint uVar1;
  uint uVar2;
  iterator __position;
  error_code eVar3;
  ulong uVar4;
  pollfd *__fds;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  native_type nVar9;
  pointer prVar10;
  size_type sVar11;
  pointer ppVar12;
  reference pvVar13;
  longlong lVar14;
  undefined8 uVar15;
  fd_set *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong in_RDX;
  pollfd *in_RSI;
  char *__file;
  long in_RDI;
  fd_set *in_R8;
  fd_set *__exceptfds;
  timeval *in_R9;
  ptime pVar16;
  error_code select_error;
  error_code dispatch_error;
  int new_events;
  io_data *cont;
  int i;
  error_code poll_error;
  int n;
  ptime diff;
  ptime wait_time;
  completion_handler disp;
  iterator evptr;
  ptime now;
  completion_handler exec;
  int counter;
  lock_guard l;
  undefined4 in_stack_fffffffffffffcf8;
  native_type in_stack_fffffffffffffcfc;
  completion_handler *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  event_loop_impl *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  error_category *in_stack_fffffffffffffd20;
  fd_set *__writefds;
  undefined8 in_stack_fffffffffffffd78;
  int hint;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  bool local_23d;
  undefined1 local_1b0 [24];
  error_category *local_198;
  error_code local_190;
  uint local_17c;
  io_data *local_178;
  int local_16c;
  __fd_mask local_168;
  error_category *peStack_160;
  undefined1 local_150 [56];
  int local_118;
  longlong local_110;
  int local_108;
  ptime local_100;
  undefined4 local_ec;
  _Base_ptr local_e8;
  _Base_ptr local_e0;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  longlong local_88;
  int local_80;
  longlong local_78;
  int local_70;
  int local_40;
  ulong local_20;
  pollfd *local_18;
  byte local_1;
  
  hint = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  __file = (char *)(in_RDI + 8);
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffd00,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  prVar10 = std::unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::get
                      ((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                        *)in_stack_fffffffffffffd00);
  iVar8 = extraout_EDX;
  if (prVar10 == (pointer)0x0) {
    __file = (char *)operator_new(8);
    reactor::reactor((reactor *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),hint);
    std::unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::reset
              ((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_> *)
               in_stack_fffffffffffffd00,
               (pointer)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    iVar8 = extraout_EDX_00;
  }
  uVar7 = impl::select_interrupter::open((select_interrupter *)(in_RDI + 0x34),__file,iVar8);
  if ((uVar7 & 1) != 0) {
    prVar10 = std::unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::
              operator->((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                          *)0x20b66f);
    nVar9 = impl::select_interrupter::get_fd((select_interrupter *)(in_RDI + 0x34));
    reactor::select(prVar10,nVar9,(fd_set *)0x1,in_RCX,in_R8,in_R9);
  }
  sVar11 = std::
           deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
           ::size((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                   *)0x20b6bf);
  local_40 = (int)sVar11;
  while( true ) {
    bVar6 = false;
    if ((*(byte *)(in_RDI + 0x3c) & 1) == 0) {
      bVar5 = std::
              deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
              ::empty((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                       *)0x20b6ee);
      bVar6 = false;
      if (!bVar5) {
        bVar6 = 0 < local_40;
      }
    }
    if (!bVar6) break;
    completion_handler::completion_handler(in_stack_fffffffffffffd00);
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::front((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
             *)in_stack_fffffffffffffd10);
    completion_handler::swap
              (in_stack_fffffffffffffd00,
               (completion_handler *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::pop_front((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                 *)in_stack_fffffffffffffd00);
    std::recursive_mutex::unlock((recursive_mutex *)0x20b774);
    completion_handler::operator()((completion_handler *)0x20b783);
    std::recursive_mutex::lock((recursive_mutex *)in_stack_fffffffffffffd00);
    local_40 = local_40 + -1;
    completion_handler::~completion_handler((completion_handler *)0x20b82c);
  }
  pVar16 = ptime::now();
  local_88 = pVar16.sec;
  local_80 = pVar16.nsec;
  local_78 = local_88;
  local_70 = local_80;
  while( true ) {
    local_23d = false;
    if ((*(byte *)(in_RDI + 0x3c) & 1) == 0) {
      bVar6 = std::
              multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
              ::empty((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                       *)0x20b8c0);
      local_23d = false;
      if (!bVar6) {
        local_90 = (_Base_ptr)
                   std::
                   multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                   ::begin((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                            *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        std::
        _Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
                      *)in_stack_fffffffffffffd00);
        local_23d = ptime::operator<=((ptime *)in_stack_fffffffffffffd00,
                                      (ptime *)CONCAT44(in_stack_fffffffffffffcfc,
                                                        in_stack_fffffffffffffcf8));
      }
    }
    if (local_23d == false) break;
    local_98 = (_Base_ptr)
               std::
               multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
               ::begin((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                        *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_a0 = (_Base_ptr)
               std::
               multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
               ::end((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
                            *)in_stack_fffffffffffffd00);
    pvVar13 = std::
              vector<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>_>
              ::operator[]((vector<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>_>
                            *)(in_RDI + 0xd8),(long)(ppVar12->second).event_id);
    pvVar13->_M_node = local_a0;
    std::
    _Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
                  *)in_stack_fffffffffffffd00);
    std::error_code::error_code((error_code *)in_stack_fffffffffffffd00);
    completion_handler::completion_handler
              ((completion_handler *)in_stack_fffffffffffffd10,
               (event_handler *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (error_code *)in_stack_fffffffffffffd00);
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                 *)in_stack_fffffffffffffd00,
                (value_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_e0 = local_98;
    __position._M_node._7_1_ = in_stack_fffffffffffffd0f;
    __position._M_node._0_7_ = in_stack_fffffffffffffd08;
    local_e8 = (_Base_ptr)
               std::
               multimap<booster::ptime,booster::aio::event_loop_impl::timer_event,std::less<booster::ptime>,std::allocator<std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>>>
               ::erase_abi_cxx11_((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                                   *)in_stack_fffffffffffffd00,__position);
    completion_handler::~completion_handler((completion_handler *)0x20ba70);
  }
  if ((*(byte *)(in_RDI + 0x3c) & 1) == 0) {
    bVar6 = std::
            deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
            ::empty((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                     *)0x20bad2);
    if (bVar6) {
      pVar16 = ptime::hours(0x20bae2);
      local_110 = pVar16.sec;
      local_108 = pVar16.nsec;
      local_100.nsec = local_108;
      local_100.sec = local_110;
    }
    else {
      local_100.sec = ptime::zero;
      local_100._8_8_ = DAT_002f79e8;
    }
    bVar6 = std::
            multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
            ::empty((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                     *)0x20bb63);
    if (!bVar6) {
      local_150._40_8_ =
           std::
           multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
           ::begin((multimap<booster::ptime,_booster::aio::event_loop_impl::timer_event,_std::less<booster::ptime>,_std::allocator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      std::
      _Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>
                    *)in_stack_fffffffffffffd00);
      pVar16 = ptime::operator-((ptime *)in_stack_fffffffffffffd00,
                                (ptime *)CONCAT44(in_stack_fffffffffffffcfc,
                                                  in_stack_fffffffffffffcf8));
      local_150._24_8_ = pVar16.sec;
      local_150._32_4_ = pVar16.nsec;
      local_150._48_8_ = local_150._24_8_;
      local_118 = local_150._32_4_;
      bVar6 = ptime::operator<((ptime *)(local_150 + 0x30),&local_100);
      if (bVar6) {
        local_100.sec = local_150._48_8_;
        local_100.nsec = local_118;
      }
    }
    local_150._20_4_ = 0;
    std::error_code::error_code((error_code *)in_stack_fffffffffffffd00);
    *(undefined1 *)(in_RDI + 0x3d) = 1;
    std::recursive_mutex::unlock((recursive_mutex *)0x20bc5d);
    prVar10 = std::unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::
              operator->((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                          *)0x20bc6c);
    __fds = local_18;
    uVar4 = local_20;
    lVar14 = ptime::milliseconds((ptime *)in_stack_fffffffffffffd00);
    __exceptfds = (fd_set *)local_150;
    local_150._20_4_ = reactor::poll(prVar10,__fds,uVar4 & 0xffffffff,(int)lVar14);
    std::recursive_mutex::lock((recursive_mutex *)in_stack_fffffffffffffd00);
    *(undefined1 *)(in_RDI + 0x3d) = 0;
    bVar6 = std::error_code::operator_cast_to_bool((error_code *)local_150);
    if (((bVar6) && (iVar8 = std::error_code::value((error_code *)local_150), iVar8 != 4)) &&
       (bVar6 = std::
                deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                ::empty((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                         *)0x20bd98), bVar6)) {
      uVar15 = __cxa_allocate_exception(0x40);
      local_168 = local_150._0_8_;
      peStack_160 = (error_category *)local_150._8_8_;
      eVar3._7_1_ = in_stack_fffffffffffffd1f;
      eVar3._0_7_ = in_stack_fffffffffffffd18;
      eVar3._M_cat = in_stack_fffffffffffffd20;
      system::system_error::system_error((system_error *)in_stack_fffffffffffffd10,eVar3);
      __cxa_throw(uVar15,&system::system_error::typeinfo,system::system_error::~system_error);
    }
    if ((int)local_20 < (int)local_150._20_4_) {
      local_150._20_4_ = (int)local_20;
    }
    randomize_events(in_stack_fffffffffffffd10,
                     (event *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    for (local_16c = 0; local_16c < (int)local_150._20_4_ && local_16c < (int)local_20;
        local_16c = local_16c + 1) {
      iVar8 = local_18[local_16c].fd;
      nVar9 = impl::select_interrupter::get_fd((select_interrupter *)(in_RDI + 0x34));
      if (iVar8 == nVar9) {
        impl::select_interrupter::clean((select_interrupter *)in_stack_fffffffffffffd00);
      }
      else {
        local_178 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                              ((socket_map<booster::aio::event_loop_impl::io_data> *)
                               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
        local_17c = local_178->current_event;
        std::error_code::error_code((error_code *)in_stack_fffffffffffffd00);
        uVar7._0_2_ = local_18[local_16c].events;
        uVar7._2_2_ = local_18[local_16c].revents;
        if ((uVar7 & 4) != 0) {
          std::error_code::error_code((error_code *)(local_1b0 + 0x10),2,aio_error_cat);
          local_190._0_8_ = local_1b0._16_8_;
          local_190._M_cat = local_198;
          local_17c = 0;
        }
        uVar1._0_2_ = local_18[local_16c].events;
        uVar1._2_2_ = local_18[local_16c].revents;
        if ((uVar1 & 1) != 0) {
          local_17c = local_17c & 0xfffffffe;
        }
        uVar2._0_2_ = local_18[local_16c].events;
        uVar2._2_2_ = local_18[local_16c].revents;
        if ((uVar2 & 2) != 0) {
          local_17c = local_17c & 0xfffffffd;
        }
        __writefds = (fd_set *)local_1b0;
        std::error_code::error_code((error_code *)in_stack_fffffffffffffd00);
        prVar10 = std::
                  unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::
                  operator->((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                              *)0x20c020);
        reactor::select(prVar10,local_18[local_16c].fd,(fd_set *)(ulong)local_17c,__writefds,
                        __exceptfds,in_R9);
        bVar6 = std::error_code::operator_cast_to_bool((error_code *)local_1b0);
        if (bVar6) {
          local_17c = 0;
          bVar6 = std::error_code::operator_cast_to_bool(&local_190);
          if (!bVar6) {
            local_190._0_8_ = local_1b0._0_8_;
            local_190._M_cat = (error_category *)local_1b0._8_8_;
          }
        }
        local_178->current_event = local_17c;
        bVar6 = callback::operator_cast_to_bool
                          ((callback<void_(const_std::error_code_&)> *)0x20c0bc);
        if ((bVar6) && ((local_17c & 1) == 0)) {
          in_stack_fffffffffffffd10 = (event_loop_impl *)(in_RDI + 0x58);
          completion_handler::completion_handler
                    ((completion_handler *)in_stack_fffffffffffffd10,
                     (event_handler *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (error_code *)in_stack_fffffffffffffd00);
          std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                       *)in_stack_fffffffffffffd00,
                      (value_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          completion_handler::~completion_handler((completion_handler *)0x20c133);
        }
        in_stack_fffffffffffffd0f =
             callback::operator_cast_to_bool((callback<void_(const_std::error_code_&)> *)0x20c16c);
        if (((bool)in_stack_fffffffffffffd0f) && ((local_17c & 2) == 0)) {
          in_stack_fffffffffffffd00 = (completion_handler *)(in_RDI + 0x58);
          completion_handler::completion_handler
                    ((completion_handler *)in_stack_fffffffffffffd10,
                     (event_handler *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (error_code *)in_stack_fffffffffffffd00);
          std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                       *)in_stack_fffffffffffffd00,
                      (value_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          completion_handler::~completion_handler((completion_handler *)0x20c1e3);
        }
        if (local_17c == 0) {
          socket_map<booster::aio::event_loop_impl::io_data>::erase
                    ((socket_map<booster::aio::event_loop_impl::io_data> *)(in_RDI + 0x40),
                     local_18[local_16c].fd);
        }
      }
    }
    if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
      wake((event_loop_impl *)0x20c26c);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_ec = 1;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffd00);
  return (bool)(local_1 & 1);
}

Assistant:

bool run_one(reactor::event *evs,size_t evs_size)
	{
		lock_guard l(data_mutex_);
		if(!reactor_.get()) {
			reactor_.reset(new reactor(reactor_type_));
		}
		if(interrupter_.open()) {
			reactor_->select(interrupter_.get_fd(),reactor::in);
		}

		int counter = dispatch_queue_.size();
		while(!stop_ && !dispatch_queue_.empty() && counter > 0) {
			completion_handler exec;
			exec.swap(dispatch_queue_.front());
			dispatch_queue_.pop_front();
			
			data_mutex_.unlock();
			try {
				
				exec();
			}
			catch(...) {
				data_mutex_.lock();
				throw;
			}
			data_mutex_.lock();
			counter --;
		}

		ptime now = ptime::now();

		while(!stop_ && !timer_events_.empty() && timer_events_.begin()->first <= now) {
			timer_events_type::iterator evptr = timer_events_.begin();
			timer_events_index_[evptr->second.event_id] = timer_events_.end();
			completion_handler disp(evptr->second.h,system::error_code());
			dispatch_queue_.push_back(disp);
			timer_events_.erase(evptr);
		}


		//
		// Restart -- dispatch timed-out timers, we also need to read now - once again
		//

		if(stop_)
			return false;

		ptime wait_time = dispatch_queue_.empty() ? ptime::hours(1) : ptime::zero;

		if(!timer_events_.empty()) {
			ptime diff = timer_events_.begin()->first - now;
			if(diff < wait_time)
				wait_time = diff;
			assert(wait_time >= ptime::zero);
		}

		
		int n = 0;

		{
			system::error_code poll_error;
			polling_ = true;
			try {
				data_mutex_.unlock();
				n = reactor_->poll(evs,evs_size,int(ptime::milliseconds(wait_time)),poll_error);
			}
			catch(...) {
				data_mutex_.lock();
				polling_ = false;
				throw;
			}
			data_mutex_.lock();
			polling_ = false;
		
			//
			// We may get EBADF, so if we do not handle it we may loop
			// forever. However, maybe there is a handler that handles this
			// in dipatch queue (for example close was executed).
			// So let's try again
			//
			// But if it empty - no handlers, abort.
			//
			if(poll_error && poll_error.value()!=EINTR && dispatch_queue_.empty()) {
				throw system::system_error(poll_error);
			}

		}

		if( n > int(evs_size) )
			n=evs_size;
		randomize_events(evs,n);
		for(int i=0;i<n && i<int(evs_size);i++) {
			
			if(evs[i].fd == interrupter_.get_fd()) {
				interrupter_.clean();
				continue;
			}
			
			using booster::system::error_code;

			io_data &cont = map_[evs[i].fd];
			
			int new_events = cont.current_event;

			error_code dispatch_error;

			if(evs[i].events & reactor::err) {
				dispatch_error = error_code(aio_error::select_failed,aio_error_cat);
				new_events = 0;
			}
			if(evs[i].events & reactor::in)
				new_events &= ~reactor::in;
			if(evs[i].events & reactor::out)
				new_events &= ~reactor::out;
			
			error_code select_error;
			reactor_->select(evs[i].fd,new_events,select_error);
			if(select_error) {
				new_events = 0;
				if(!dispatch_error)
					dispatch_error=select_error;
			}
			
			cont.current_event = new_events;

			if(cont.readable && (new_events & reactor::in) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.readable,dispatch_error));
			}
			if(cont.writeable && (new_events & reactor::out) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.writeable,dispatch_error));
			}
			
			if(new_events == 0)
				map_.erase(evs[i].fd);
		}

		if(stop_) {
			wake();
		}

		return true;

	}